

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O3

void __thiscall
glslang::TBuiltIns::addImageFunctions
          (TBuiltIns *this,TSampler sampler,TString *typeName,int version,EProfile profile)

{
  TString *this_00;
  pointer pcVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  TString imageParams;
  TString imageLodParams;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_c0;
  uint local_98;
  EProfile local_94;
  ulong local_90;
  uint local_84;
  long local_80;
  ulong local_78;
  TBuiltIns *local_70;
  TString *local_68;
  ulong local_60;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  local_90 = (ulong)(uint)sampler;
  local_60 = (ulong)sampler._1_1_;
  lVar7 = (ulong)((uint)(sampler._1_1_ != 4) & (uint)sampler >> 0x10) + (long)this->dimMap[local_60]
  ;
  local_c0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  pcVar1 = (typeName->_M_dataplus)._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_68 = typeName;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                      &local_c0,pcVar1,pcVar1 + typeName->_M_string_length);
  if ((int)lVar7 == 1) {
    pcVar8 = ", int";
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&local_c0,", ivec");
    pcVar8 = this->postfixes[lVar7];
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (&local_c0,pcVar8);
  uVar4 = local_90;
  uVar6 = (uint)local_90;
  if ((uVar6 >> 0x12 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&local_c0,", int");
  }
  if (profile == EEsProfile) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,"highp ");
  }
  this_00 = &(this->super_TBuiltInParseables).commonBuiltins;
  uVar9 = uVar4 & 0xff;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,this->prefixes[uVar9]);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,"vec4 imageLoad(readonly volatile coherent nontemporal ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,");\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,"void imageStore(writeonly volatile coherent nontemporal ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,", ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,this->prefixes[uVar9]);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,"vec4);\n");
  local_84 = uVar6 & 0xff00;
  if ((((local_84 == 0x100) || (version < 0x1c2)) || (local_84 == 0x600)) || (profile == EEsProfile)
     ) {
    bVar10 = profile != EEsProfile;
    bVar2 = 0x135 < version;
    if (!bVar2 && !bVar10) goto LAB_003fd3f2;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"int sparseImageLoadARB(readonly volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", out ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,this->prefixes[uVar9]);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"vec4");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,");\n");
    bVar2 = true;
    bVar10 = true;
  }
  local_94 = profile;
  local_80 = lVar7;
  local_78 = uVar9;
  local_70 = this;
  if ((uVar6 & 0xfc) == 8) {
    uVar4 = (ulong)(uVar6 - 8);
    bVar3 = (byte)(uVar6 - 8);
    if (bVar3 < 4) {
      uVar4 = (ulong)bVar3;
      pcVar8 = &DAT_007041b0 + *(int *)(&DAT_007041b0 + uVar4 * 4);
    }
    else {
      pcVar8 = "";
    }
    uVar5 = CONCAT71((int7)(uVar4 >> 8),1);
    bVar2 = false;
    do {
      local_98 = (uint)uVar5;
      lVar7 = 0;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_00,pcVar8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_00,(char *)((long)&
                                      _ZZN7glslang9TBuiltIns17addImageFunctionsENS_8TSamplerERKNSt7__cxx1112basic_stringIcSt11char_traitsIcENS_14pool_allocatorIcEEEEi8EProfileE10atomicFunc_rel
                               + (long)*(int *)((long)&
                                                  _ZZN7glslang9TBuiltIns17addImageFunctionsENS_8TSamplerERKNSt7__cxx1112basic_stringIcSt11char_traitsIcENS_14pool_allocatorIcEEEEi8EProfileE10atomicFunc_rel
                                               + lVar7)));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_00,", ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_00,pcVar8);
        if (bVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_00,", int, int, int");
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_00,");\n");
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x1c);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,pcVar8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00," imageAtomicCompSwap(volatile coherent nontemporal ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,", ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,pcVar8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,", ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,pcVar8);
      if (bVar2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_00,", int, int, int, int, int");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_00,");\n");
        break;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,");\n");
      bVar2 = true;
      uVar5 = 0;
    } while ((local_98 & 1) != 0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,pcVar8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00," imageAtomicLoad(volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", int, int, int);\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"void imageAtomicStore(volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", ");
    uVar4 = local_90;
    lVar7 = local_80;
    uVar9 = local_78;
    this = local_70;
  }
  else {
    uVar5 = 0;
    if (!(bool)(bVar2 ^ 1U | profile != EEsProfile)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,"float imageAtomicExchange(volatile coherent nontemporal ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,", float);\n");
    }
    if (0x1ad < version && !(bool)(bVar10 ^ 1U)) {
      uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
      lVar7 = 0;
      do {
        local_98 = (uint)uVar5;
        pcVar8 = (char *)(&DAT_009291b0)[lVar7];
        lVar7 = 0;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_00,pcVar8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_00,(char *)((long)&DAT_0070415c + (long)*(int *)((long)&DAT_0070415c + lVar7))
                );
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_00,", ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_00,pcVar8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_00,");\n");
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x10);
        lVar7 = 1;
        uVar5 = 0;
      } while ((local_98 & 1) != 0);
    }
    this = local_70;
    uVar9 = local_78;
    lVar7 = local_80;
    uVar4 = local_90;
    profile = local_94;
    if (version < 0x1c2 || (bool)(bVar10 ^ 1U)) goto LAB_003fd3f2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"float imageAtomicAdd(volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", float);\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"float imageAtomicAdd(volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    pcVar8 = ", float";
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", float");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", int, int, int);\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"float imageAtomicExchange(volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", float);\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"float imageAtomicExchange(volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", float");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", int, int, int);\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"float imageAtomicLoad(readonly volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", int, int, int);\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"void imageAtomicStore(writeonly volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", float");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", int, int, int);\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"float imageAtomicMin(volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", float);\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"float imageAtomicMin(volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", float");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", int, int, int);\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"float imageAtomicMax(volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", float);\n");
    uVar4 = local_90;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"float imageAtomicMax(volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,pcVar8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,", int, int, int);\n");
  profile = local_94;
LAB_003fd3f2:
  if ((((uVar4 >> 0x11 & 1) == 0 && (int)local_60 - 7U < 0xfffffffe) &&
      (((uint)uVar4 >> 0x12 & 1) == 0)) && ((0x1c1 < version && (profile != EEsProfile)))) {
    local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    pcVar1 = (local_68->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &local_58,pcVar1,pcVar1 + local_68->_M_string_length);
    if ((int)lVar7 == 1) {
      pcVar8 = ", int";
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&local_58,", ivec");
      pcVar8 = this->postfixes[(int)lVar7];
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&local_58,pcVar8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&local_58,", int");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,this->prefixes[uVar9]);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"vec4 imageLoadLodAMD(readonly volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,");\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"void imageStoreLodAMD(writeonly volatile coherent nontemporal ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append(this_00,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,", ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,this->prefixes[uVar9]);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"vec4);\n");
    if (local_84 != 0x100) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,"int sparseImageLoadLodAMD(readonly volatile coherent nontemporal ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(this_00,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,", out ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,this->prefixes[uVar9]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,"vec4");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_00,");\n");
    }
  }
  return;
}

Assistant:

void TBuiltIns::addImageFunctions(TSampler sampler, const TString& typeName, int version, EProfile profile)
{
    int dims = dimMap[sampler.dim];
    // most things with an array add a dimension, except for cubemaps
    if (sampler.arrayed && sampler.dim != EsdCube)
        ++dims;

    TString imageParams = typeName;
    if (dims == 1)
        imageParams.append(", int");
    else {
        imageParams.append(", ivec");
        imageParams.append(postfixes[dims]);
    }
    if (sampler.isMultiSample())
        imageParams.append(", int");

    if (profile == EEsProfile)
        commonBuiltins.append("highp ");
    commonBuiltins.append(prefixes[sampler.type]);
    commonBuiltins.append("vec4 imageLoad(readonly volatile coherent nontemporal ");
    commonBuiltins.append(imageParams);
    commonBuiltins.append(");\n");

    commonBuiltins.append("void imageStore(writeonly volatile coherent nontemporal ");
    commonBuiltins.append(imageParams);
    commonBuiltins.append(", ");
    commonBuiltins.append(prefixes[sampler.type]);
    commonBuiltins.append("vec4);\n");

    if (! sampler.is1D() && ! sampler.isBuffer() && profile != EEsProfile && version >= 450) {
        commonBuiltins.append("int sparseImageLoadARB(readonly volatile coherent nontemporal ");
        commonBuiltins.append(imageParams);
        commonBuiltins.append(", out ");
        commonBuiltins.append(prefixes[sampler.type]);
        commonBuiltins.append("vec4");
        commonBuiltins.append(");\n");
    }

    if ( profile != EEsProfile ||
        (profile == EEsProfile && version >= 310)) {
        if (sampler.type == EbtInt || sampler.type == EbtUint || sampler.type == EbtInt64 || sampler.type == EbtUint64 ) {
            
            const char* dataType;
            switch (sampler.type) {
                case(EbtInt): dataType = "highp int"; break;
                case(EbtUint): dataType = "highp uint"; break;
                case(EbtInt64): dataType = "highp int64_t"; break;
                case(EbtUint64): dataType = "highp uint64_t"; break;
                default: dataType = "";
            }

            const int numBuiltins = 7;

            static const char* atomicFunc[numBuiltins] = {
                " imageAtomicAdd(volatile coherent nontemporal ",
                " imageAtomicMin(volatile coherent nontemporal ",
                " imageAtomicMax(volatile coherent nontemporal ",
                " imageAtomicAnd(volatile coherent nontemporal ",
                " imageAtomicOr(volatile coherent nontemporal ",
                " imageAtomicXor(volatile coherent nontemporal ",
                " imageAtomicExchange(volatile coherent nontemporal "
            };

            // Loop twice to add prototypes with/without scope/semantics
            for (int j = 0; j < 2; ++j) {
                for (size_t i = 0; i < numBuiltins; ++i) {
                    commonBuiltins.append(dataType);
                    commonBuiltins.append(atomicFunc[i]);
                    commonBuiltins.append(imageParams);
                    commonBuiltins.append(", ");
                    commonBuiltins.append(dataType);
                    if (j == 1) {
                        commonBuiltins.append(", int, int, int");
                    }
                    commonBuiltins.append(");\n");
                }

                commonBuiltins.append(dataType);
                commonBuiltins.append(" imageAtomicCompSwap(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", ");
                commonBuiltins.append(dataType);
                commonBuiltins.append(", ");
                commonBuiltins.append(dataType);
                if (j == 1) {
                    commonBuiltins.append(", int, int, int, int, int");
                }
                commonBuiltins.append(");\n");
            }

            commonBuiltins.append(dataType);
            commonBuiltins.append(" imageAtomicLoad(volatile coherent nontemporal ");
            commonBuiltins.append(imageParams);
            commonBuiltins.append(", int, int, int);\n");

            commonBuiltins.append("void imageAtomicStore(volatile coherent nontemporal ");
            commonBuiltins.append(imageParams);
            commonBuiltins.append(", ");
            commonBuiltins.append(dataType);
            commonBuiltins.append(", int, int, int);\n");

        } else {
            // not int or uint
            // GL_ARB_ES3_1_compatibility
            // TODO: spec issue: are there restrictions on the kind of layout() that can be used?  what about dropping memory qualifiers?
            if (profile == EEsProfile && version >= 310) {
                commonBuiltins.append("float imageAtomicExchange(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float);\n");
            }

            // GL_NV_shader_atomic_fp16_vector
            if (profile != EEsProfile && version >= 430) {
                const int numFp16Builtins = 4;
                const char* atomicFp16Func[numFp16Builtins] = {
                    " imageAtomicAdd(volatile coherent nontemporal ",
                    " imageAtomicMin(volatile coherent nontemporal ",
                    " imageAtomicMax(volatile coherent nontemporal ",
                    " imageAtomicExchange(volatile coherent nontemporal "
                };
                const int numFp16DataTypes = 2;
                const char* atomicFp16DataTypes[numFp16DataTypes] = {
                    "f16vec2",
                    "f16vec4"
                };
                // Loop twice to add prototypes with/without scope/semantics
                for (int j = 0; j < numFp16DataTypes; ++j) {
                    for (int i = 0; i < numFp16Builtins; ++i) {
                        commonBuiltins.append(atomicFp16DataTypes[j]);
                        commonBuiltins.append(atomicFp16Func[i]);
                        commonBuiltins.append(imageParams);
                        commonBuiltins.append(", ");
                        commonBuiltins.append(atomicFp16DataTypes[j]);
                        commonBuiltins.append(");\n");
                    }
                }
            }

            if (profile != EEsProfile && version >= 450) {
                commonBuiltins.append("float imageAtomicAdd(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float);\n");

                commonBuiltins.append("float imageAtomicAdd(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float");
                commonBuiltins.append(", int, int, int);\n");

                commonBuiltins.append("float imageAtomicExchange(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float);\n");

                commonBuiltins.append("float imageAtomicExchange(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float");
                commonBuiltins.append(", int, int, int);\n");

                commonBuiltins.append("float imageAtomicLoad(readonly volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", int, int, int);\n");

                commonBuiltins.append("void imageAtomicStore(writeonly volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float");
                commonBuiltins.append(", int, int, int);\n");

                commonBuiltins.append("float imageAtomicMin(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float);\n");

                commonBuiltins.append("float imageAtomicMin(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float");
                commonBuiltins.append(", int, int, int);\n");

                commonBuiltins.append("float imageAtomicMax(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float);\n");

                commonBuiltins.append("float imageAtomicMax(volatile coherent nontemporal ");
                commonBuiltins.append(imageParams);
                commonBuiltins.append(", float");
                commonBuiltins.append(", int, int, int);\n");
            }
        }
    }

    if (sampler.dim == EsdRect || sampler.dim == EsdBuffer || sampler.shadow || sampler.isMultiSample())
        return;

    if (profile == EEsProfile || version < 450)
        return;

    TString imageLodParams = typeName;
    if (dims == 1)
        imageLodParams.append(", int");
    else {
        imageLodParams.append(", ivec");
        imageLodParams.append(postfixes[dims]);
    }
    imageLodParams.append(", int");

    commonBuiltins.append(prefixes[sampler.type]);
    commonBuiltins.append("vec4 imageLoadLodAMD(readonly volatile coherent nontemporal ");
    commonBuiltins.append(imageLodParams);
    commonBuiltins.append(");\n");

    commonBuiltins.append("void imageStoreLodAMD(writeonly volatile coherent nontemporal ");
    commonBuiltins.append(imageLodParams);
    commonBuiltins.append(", ");
    commonBuiltins.append(prefixes[sampler.type]);
    commonBuiltins.append("vec4);\n");

    if (! sampler.is1D()) {
        commonBuiltins.append("int sparseImageLoadLodAMD(readonly volatile coherent nontemporal ");
        commonBuiltins.append(imageLodParams);
        commonBuiltins.append(", out ");
        commonBuiltins.append(prefixes[sampler.type]);
        commonBuiltins.append("vec4");
        commonBuiltins.append(");\n");
    }
}